

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spaceusage.c
# Opt level: O2

sizes xor16(size_t n)

{
  ulong *puVar1;
  ushort uVar2;
  undefined4 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  size_t i;
  void *__ptr;
  uint64_t *keys;
  uint64_t uVar6;
  void *__s;
  void *__ptr_00;
  void *__ptr_01;
  ulong uVar7;
  int *piVar8;
  long lVar9;
  size_t i_5;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong *puVar13;
  ulong uVar14;
  long lVar15;
  size_t i_2;
  long lVar16;
  size_t sVar17;
  size_t i_3;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  size_t i_1;
  ulong uVar25;
  size_t __size;
  size_t sVar26;
  double dVar27;
  sizes sVar28;
  ulong local_98;
  uint64_t local_78;
  uint64_t local_38;
  
  dVar27 = (double)(n & 0xffffffff) * 1.23 + 32.0;
  uVar10 = (ulong)dVar27;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(dVar27 - 9.223372036854776e+18) & (long)uVar10 >> 0x3f | uVar10;
  uVar10 = SUB168(auVar4 / ZEXT816(3),0);
  __ptr = malloc(uVar10 * 6);
  if (__ptr == (void *)0x0) {
    puts("allocation failed");
    sVar26 = 0;
    sVar17 = 0;
  }
  else {
    keys = (uint64_t *)malloc(n * 8);
    for (uVar6 = 0; n != uVar6; uVar6 = uVar6 + 1) {
      keys[uVar6] = uVar6;
    }
    if ((int)n != 0) {
      local_38 = 1;
      local_78 = xor_rng_splitmix64(&local_38);
      __size = uVar10 * 0x30;
      __s = malloc(__size);
      __ptr_00 = malloc(__size);
      __ptr_01 = malloc((n & 0xffffffff) << 4);
      if (__ptr_01 != (void *)0x0 && (__ptr_00 != (void *)0x0 && __s != (void *)0x0)) {
        lVar15 = uVar10 * 0x10;
        lVar11 = uVar10 * 0x20;
        iVar5 = SUB164(auVar4 / ZEXT816(3),0);
        uVar24 = uVar10 & 0xffffffff;
        uVar19 = 0;
        local_98 = n;
        do {
          if (uVar19 + 1 == 10) {
            local_98 = xor_sort_and_remove_dup(keys,local_98 & 0xffffffff);
          }
          else if (99 < uVar19) break;
          memset(__s,0,__size);
          uVar7 = local_98 & 0xffffffff;
          for (uVar25 = 0; uVar7 != uVar25; uVar25 = uVar25 + 1) {
            uVar6 = xor_mix_split(keys[uVar25],local_78);
            uVar18 = (uVar6 & 0xffffffff) * uVar24 >> 0x1c & 0xfffffffffffffff0;
            puVar1 = (ulong *)((long)__s + uVar18);
            *puVar1 = *puVar1 ^ uVar6;
            piVar8 = (int *)((long)__s + uVar18 + 8);
            *piVar8 = *piVar8 + 1;
            uVar18 = ((uint)(uVar6 << 0x15) | (uint)(uVar6 >> 0x2b)) * uVar24 >> 0x1c &
                     0xfffffffffffffff0;
            puVar1 = (ulong *)((long)__s + uVar18 + lVar15);
            *puVar1 = *puVar1 ^ uVar6;
            piVar8 = (int *)((long)__s + uVar18 + lVar15 + 8);
            *piVar8 = *piVar8 + 1;
            uVar18 = (uVar6 >> 0x16 & 0xffffffff) * uVar24 >> 0x1c & 0xfffffffffffffff0;
            puVar1 = (ulong *)((long)__s + uVar18 + lVar11);
            *puVar1 = *puVar1 ^ uVar6;
            piVar8 = (int *)((long)__s + uVar18 + lVar11 + 8);
            *piVar8 = *piVar8 + 1;
          }
          lVar12 = 0;
          piVar8 = (int *)((long)__s + 8);
          for (uVar25 = 0; uVar10 != uVar25; uVar25 = uVar25 + 1) {
            if (*piVar8 == 1) {
              *(int *)((long)__ptr_00 + lVar12 * 0x10 + 8) = (int)uVar25;
              *(undefined8 *)((long)__ptr_00 + lVar12 * 0x10) = *(undefined8 *)(piVar8 + -2);
              lVar12 = lVar12 + 1;
            }
            piVar8 = piVar8 + 4;
          }
          lVar9 = 0;
          piVar8 = (int *)((long)__s + lVar15 + 8);
          for (uVar25 = 0; uVar10 != uVar25; uVar25 = uVar25 + 1) {
            if (*piVar8 == 1) {
              *(int *)((long)__ptr_00 + lVar9 * 0x10 + lVar15 + 8) = (int)uVar25;
              *(undefined8 *)((long)__ptr_00 + lVar9 * 0x10 + lVar15) = *(undefined8 *)(piVar8 + -2)
              ;
              lVar9 = lVar9 + 1;
            }
            piVar8 = piVar8 + 4;
          }
          lVar16 = 0;
          piVar8 = (int *)((long)__s + lVar11 + 8);
          for (uVar25 = 0; uVar10 != uVar25; uVar25 = uVar25 + 1) {
            if (*piVar8 == 1) {
              *(int *)((long)__ptr_00 + lVar16 * 0x10 + lVar11 + 8) = (int)uVar25;
              *(undefined8 *)((long)__ptr_00 + lVar16 * 0x10 + lVar11) =
                   *(undefined8 *)(piVar8 + -2);
              lVar16 = lVar16 + 1;
            }
            piVar8 = piVar8 + 4;
          }
          uVar25 = 0;
LAB_001024f0:
          if (lVar12 + lVar9 + lVar16 != 0) {
            do {
              lVar20 = -lVar12;
              puVar1 = (ulong *)(lVar12 * 0x10 + (long)__ptr_00);
              do {
                puVar13 = puVar1;
                lVar20 = lVar20 + 1;
                if (lVar20 == 1) {
                  lVar12 = 0;
                  goto LAB_001025ff;
                }
                uVar18 = puVar13[-1];
                puVar1 = puVar13 + -2;
              } while (*(int *)((long)__s + (ulong)(uint)uVar18 * 0x10 + 8) == 0);
              uVar21 = puVar13[-2];
              uVar3 = *(undefined4 *)((long)puVar13 + -4);
              uVar14 = ((uint)(uVar21 << 0x15) | (uint)(uVar21 >> 0x2b)) * uVar24;
              lVar12 = uVar25 * 0x10;
              *(ulong *)((long)__ptr_01 + lVar12) = uVar21;
              *(uint *)((long)__ptr_01 + lVar12 + 8) = (uint)uVar18;
              *(undefined4 *)((long)__ptr_01 + lVar12 + 0xc) = uVar3;
              lVar12 = (uVar14 >> 0x20) * 0x10;
              uVar18 = *(ulong *)((long)__s + lVar12 + lVar15) ^ uVar21;
              *(ulong *)((long)__s + lVar12 + lVar15) = uVar18;
              iVar23 = *(int *)((long)__s + lVar12 + lVar15 + 8) + -1;
              *(int *)((long)__s + lVar12 + lVar15 + 8) = iVar23;
              if (iVar23 == 1) {
                *(int *)((long)__ptr_00 + lVar9 * 0x10 + lVar15 + 8) = (int)(uVar14 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar9 * 0x10 + lVar15) = uVar18;
                lVar9 = lVar9 + 1;
              }
              uVar18 = (uVar21 >> 0x16 & 0xffffffff) * uVar24;
              uVar25 = uVar25 + 1;
              lVar12 = -lVar20;
              lVar22 = (uVar18 >> 0x20) * 0x10;
              uVar21 = uVar21 ^ *(ulong *)((long)__s + lVar22 + lVar11);
              *(ulong *)((long)__s + lVar22 + lVar11) = uVar21;
              iVar23 = *(int *)((long)__s + lVar22 + lVar11 + 8) + -1;
              *(int *)((long)__s + lVar22 + lVar11 + 8) = iVar23;
              if (iVar23 == 1) {
                *(int *)((long)__ptr_00 + lVar16 * 0x10 + lVar11 + 8) = (int)(uVar18 >> 0x20);
                *(ulong *)((long)__ptr_00 + lVar16 * 0x10 + lVar11) = uVar21;
                lVar16 = lVar16 + 1;
                lVar12 = -lVar20;
              }
            } while( true );
          }
          if (uVar25 == uVar7) {
            for (lVar15 = uVar7 << 4; lVar15 != 0; lVar15 = lVar15 + -0x10) {
              uVar7 = *(ulong *)((long)__ptr_01 + lVar15 + -0x10);
              uVar25 = (ulong)*(uint *)((long)__ptr_01 + lVar15 + -8);
              uVar19 = (uint)(uVar7 >> 0x20);
              if (uVar25 < uVar10) {
                uVar2 = *(ushort *)
                         ((long)__ptr +
                         (((uint)(uVar7 << 0x15) | uVar19 >> 0xb) * uVar24 >> 0x20) * 2 + uVar10 * 2
                         );
LAB_00102883:
                uVar19 = (uint)(uVar7 >> 0x16);
                uVar18 = uVar10 * 2;
              }
              else {
                uVar2 = *(ushort *)((long)__ptr + ((uVar7 & 0xffffffff) * uVar24 >> 0x20) * 2);
                if (uVar25 < uVar10 * 2) goto LAB_00102883;
                uVar19 = (uint)(uVar7 << 0x15) | uVar19 >> 0xb;
                uVar18 = uVar10;
              }
              *(ushort *)((long)__ptr + uVar25 * 2) =
                   uVar2 ^ (ushort)(uVar7 >> 0x20) ^ (ushort)uVar7 ^
                   *(ushort *)((long)__ptr + (uVar19 * uVar24 >> 0x20) * 2 + uVar18 * 2);
            }
            free(__s);
            free(__ptr_00);
            free(__ptr_01);
            goto LAB_001028e2;
          }
          local_78 = xor_rng_splitmix64(&local_38);
          uVar19 = uVar19 + 1;
        } while( true );
      }
      free(__s);
      free(__ptr_00);
      free(__ptr_01);
    }
    puts("populating failed");
LAB_001028e2:
    free(keys);
    sVar17 = (uVar10 * 3 + 7 >> 3) + 0x10;
    for (lVar15 = 0; uVar10 * 3 != lVar15; lVar15 = lVar15 + 1) {
      if (*(short *)((long)__ptr + lVar15 * 2) != 0) {
        sVar17 = sVar17 + 2;
      }
    }
    sVar26 = uVar10 * 6 + 0x10;
    free(__ptr);
  }
  sVar28.pack = sVar17;
  sVar28.standard = sVar26;
  return sVar28;
LAB_001025ff:
  lVar20 = -lVar9;
  puVar1 = (ulong *)((long)__ptr_00 + lVar9 * 0x10 + lVar15);
  do {
    puVar13 = puVar1;
    lVar20 = lVar20 + 1;
    if (lVar20 == 1) {
      lVar9 = 0;
      goto LAB_001026fd;
    }
    uVar18 = puVar13[-1];
    puVar1 = puVar13 + -2;
  } while (*(int *)((long)__s + (ulong)(uint)uVar18 * 0x10 + lVar15 + 8) == 0);
  uVar21 = puVar13[-2];
  uVar3 = *(undefined4 *)((long)puVar13 + -4);
  uVar14 = (uVar21 & 0xffffffff) * uVar24;
  lVar9 = uVar25 * 0x10;
  *(ulong *)((long)__ptr_01 + lVar9) = uVar21;
  *(uint *)((long)__ptr_01 + lVar9 + 8) = (uint)uVar18 + iVar5;
  *(undefined4 *)((long)__ptr_01 + lVar9 + 0xc) = uVar3;
  lVar9 = (uVar14 >> 0x20) * 0x10;
  uVar18 = *(ulong *)((long)__s + lVar9) ^ uVar21;
  *(ulong *)((long)__s + lVar9) = uVar18;
  iVar23 = *(int *)((long)__s + lVar9 + 8) + -1;
  *(int *)((long)__s + lVar9 + 8) = iVar23;
  if (iVar23 == 1) {
    *(int *)((long)__ptr_00 + lVar12 * 0x10 + 8) = (int)(uVar14 >> 0x20);
    *(ulong *)((long)__ptr_00 + lVar12 * 0x10) = uVar18;
    lVar12 = lVar12 + 1;
  }
  uVar18 = (uVar21 >> 0x16 & 0xffffffff) * uVar24;
  uVar25 = uVar25 + 1;
  lVar9 = -lVar20;
  lVar20 = (uVar18 >> 0x20) * 0x10;
  uVar21 = uVar21 ^ *(ulong *)((long)__s + lVar20 + lVar11);
  *(ulong *)((long)__s + lVar20 + lVar11) = uVar21;
  iVar23 = *(int *)((long)__s + lVar20 + lVar11 + 8) + -1;
  *(int *)((long)__s + lVar20 + lVar11 + 8) = iVar23;
  if (iVar23 == 1) {
    *(int *)((long)__ptr_00 + lVar16 * 0x10 + lVar11 + 8) = (int)(uVar18 >> 0x20);
    *(ulong *)((long)__ptr_00 + lVar16 * 0x10 + lVar11) = uVar21;
    lVar16 = lVar16 + 1;
  }
  goto LAB_001025ff;
LAB_001026fd:
  lVar20 = -lVar16;
  puVar1 = (ulong *)((long)__ptr_00 + lVar16 * 0x10 + lVar11);
  do {
    puVar13 = puVar1;
    lVar20 = lVar20 + 1;
    if (lVar20 == 1) {
      lVar16 = 0;
      goto LAB_001024f0;
    }
    uVar18 = puVar13[-1];
    puVar1 = puVar13 + -2;
  } while (*(int *)((long)__s + (ulong)(uint)uVar18 * 0x10 + lVar11 + 8) == 0);
  uVar21 = puVar13[-2];
  uVar3 = *(undefined4 *)((long)puVar13 + -4);
  uVar14 = (uVar21 & 0xffffffff) * uVar24;
  lVar16 = uVar25 * 0x10;
  *(ulong *)((long)__ptr_01 + lVar16) = uVar21;
  *(uint *)((long)__ptr_01 + lVar16 + 8) = (uint)uVar18 + iVar5 * 2;
  *(undefined4 *)((long)__ptr_01 + lVar16 + 0xc) = uVar3;
  lVar16 = (uVar14 >> 0x20) * 0x10;
  uVar18 = *(ulong *)((long)__s + lVar16) ^ uVar21;
  *(ulong *)((long)__s + lVar16) = uVar18;
  iVar23 = *(int *)((long)__s + lVar16 + 8) + -1;
  *(int *)((long)__s + lVar16 + 8) = iVar23;
  if (iVar23 == 1) {
    *(int *)((long)__ptr_00 + lVar12 * 0x10 + 8) = (int)(uVar14 >> 0x20);
    *(ulong *)((long)__ptr_00 + lVar12 * 0x10) = uVar18;
    lVar12 = lVar12 + 1;
  }
  uVar18 = ((uint)(uVar21 << 0x15) | (uint)(uVar21 >> 0x2b)) * uVar24;
  uVar25 = uVar25 + 1;
  lVar16 = -lVar20;
  lVar20 = (uVar18 >> 0x20) * 0x10;
  uVar21 = uVar21 ^ *(ulong *)((long)__s + lVar20 + lVar15);
  *(ulong *)((long)__s + lVar20 + lVar15) = uVar21;
  iVar23 = *(int *)((long)__s + lVar20 + lVar15 + 8) + -1;
  *(int *)((long)__s + lVar20 + lVar15 + 8) = iVar23;
  if (iVar23 == 1) {
    *(int *)((long)__ptr_00 + lVar9 * 0x10 + lVar15 + 8) = (int)(uVar18 >> 0x20);
    *(ulong *)((long)__ptr_00 + lVar9 * 0x10 + lVar15) = uVar21;
    lVar9 = lVar9 + 1;
  }
  goto LAB_001026fd;
}

Assistant:

sizes xor16(size_t n) {
  xor16_t filter = {0};
  if (! xor16_allocate(n, &filter)) {
    printf("allocation failed\n");
    return (sizes) {0, 0};
  }
  uint64_t* big_set = malloc(n * sizeof(uint64_t));
  for(size_t i = 0; i < n; i++) {
    big_set[i] = i;
  }
  bool is_ok = xor16_populate(big_set, n, &filter);
  if(! is_ok ) {
    printf("populating failed\n");
  }
  free(big_set);
  sizes s = {
    .standard = xor16_serialization_bytes(&filter),
    .pack = xor16_pack_bytes(&filter)
  };
  xor16_free(&filter);
  return s;
}